

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::SELU_x86_avx::forward_inplace(SELU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  undefined1 auVar8 [32];
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  undefined1 (*pauVar14) [32];
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  
  iVar7 = bottom_top_blob->c;
  if (0 < (long)iVar7) {
    uVar13 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    lVar15 = 0;
    auVar37 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    auVar36 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
    auVar38 = ZEXT1664(ZEXT816(0) << 0x40);
    do {
      pauVar14 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      uVar1 = (this->super_SELU).alpha;
      uVar4 = (this->super_SELU).lambda;
      auVar16._4_4_ = uVar4;
      auVar16._0_4_ = uVar1;
      auVar16._8_8_ = 0;
      auVar35 = auVar36._0_16_;
      if ((int)uVar13 < 8) {
        uVar11 = 0;
      }
      else {
        auVar26 = vshufps_avx(auVar16,auVar16,0);
        auVar16 = vshufps_avx(auVar16,auVar16,0x55);
        iVar9 = 7;
        do {
          auVar31 = vminps_avx(ZEXT1632(ZEXT816(0) << 0x40),*pauVar14);
          auVar29._8_4_ = 0x42b0c0a5;
          auVar29._0_8_ = 0x42b0c0a542b0c0a5;
          auVar29._12_4_ = 0x42b0c0a5;
          auVar29._16_4_ = 0x42b0c0a5;
          auVar29._20_4_ = 0x42b0c0a5;
          auVar29._24_4_ = 0x42b0c0a5;
          auVar29._28_4_ = 0x42b0c0a5;
          auVar31 = vminps_avx(auVar31,auVar29);
          auVar30._8_4_ = 0xc2b0c0a5;
          auVar30._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar30._12_4_ = 0xc2b0c0a5;
          auVar30._16_4_ = 0xc2b0c0a5;
          auVar30._20_4_ = 0xc2b0c0a5;
          auVar30._24_4_ = 0xc2b0c0a5;
          auVar30._28_4_ = 0xc2b0c0a5;
          auVar29 = vmaxps_avx(auVar31,auVar30);
          auVar31._0_4_ = auVar29._0_4_ * 1.442695 + 0.5;
          auVar31._4_4_ = auVar29._4_4_ * 1.442695 + 0.5;
          auVar31._8_4_ = auVar29._8_4_ * 1.442695 + 0.5;
          auVar31._12_4_ = auVar29._12_4_ * 1.442695 + 0.5;
          auVar31._16_4_ = auVar29._16_4_ * 1.442695 + 0.5;
          auVar31._20_4_ = auVar29._20_4_ * 1.442695 + 0.5;
          auVar31._24_4_ = auVar29._24_4_ * 1.442695 + 0.5;
          auVar31._28_4_ = 0x3ff8aa3b;
          auVar8 = vroundps_avx(auVar31,1);
          auVar31 = vcmpps_avx(auVar31,auVar8,1);
          auVar31 = vandps_avx(auVar37._0_32_,auVar31);
          auVar31 = vsubps_avx(auVar8,auVar31);
          fVar18 = auVar29._0_4_ + auVar31._0_4_ * -0.6931472;
          fVar19 = auVar29._4_4_ + auVar31._4_4_ * -0.6931472;
          fVar20 = auVar29._8_4_ + auVar31._8_4_ * -0.6931472;
          fVar21 = auVar29._12_4_ + auVar31._12_4_ * -0.6931472;
          fVar22 = auVar29._16_4_ + auVar31._16_4_ * -0.6931472;
          fVar23 = auVar29._20_4_ + auVar31._20_4_ * -0.6931472;
          fVar24 = auVar29._24_4_ + auVar31._24_4_ * -0.6931472;
          auVar25._0_4_ = (int)auVar31._0_4_;
          auVar25._4_4_ = (int)auVar31._4_4_;
          auVar25._8_4_ = (int)auVar31._8_4_;
          auVar25._12_4_ = (int)auVar31._12_4_;
          auVar32._16_4_ = (int)auVar31._16_4_;
          auVar32._0_16_ = auVar25;
          auVar32._20_4_ = (int)auVar31._20_4_;
          auVar32._24_4_ = (int)auVar31._24_4_;
          auVar32._28_4_ = (int)auVar31._28_4_;
          auVar33 = vpslld_avx(auVar25,0x17);
          auVar25 = vpslld_avx(auVar32._16_16_,0x17);
          auVar25 = vpaddd_avx(auVar35,auVar25);
          auVar33 = vpaddd_avx(auVar35,auVar33);
          auVar31 = vmaxps_avx(ZEXT1632(ZEXT816(0) << 0x40),*pauVar14);
          auVar8._4_4_ = (((auVar37._4_4_ + fVar19 +
                           fVar19 * fVar19 *
                           (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) *
                              fVar19 + 0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5)) *
                           auVar33._4_4_ + -1.0) * auVar26._4_4_ + auVar31._4_4_) * auVar16._4_4_;
          auVar8._0_4_ = (((auVar37._0_4_ + fVar18 +
                           fVar18 * fVar18 *
                           (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) *
                              fVar18 + 0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5)) *
                           auVar33._0_4_ + -1.0) * auVar26._0_4_ + auVar31._0_4_) * auVar16._0_4_;
          auVar8._8_4_ = (((auVar37._8_4_ + fVar20 +
                           fVar20 * fVar20 *
                           (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) *
                              fVar20 + 0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5)) *
                           auVar33._8_4_ + -1.0) * auVar26._8_4_ + auVar31._8_4_) * auVar16._8_4_;
          auVar8._12_4_ =
               (((auVar37._12_4_ + fVar21 +
                 fVar21 * fVar21 *
                 (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
                   0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5)) * auVar33._12_4_ + -1.0) *
                auVar26._12_4_ + auVar31._12_4_) * auVar16._12_4_;
          auVar8._16_4_ =
               (((auVar37._16_4_ + fVar22 +
                 fVar22 * fVar22 *
                 (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
                   0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5)) * auVar25._0_4_ + -1.0) *
                auVar26._0_4_ + auVar31._16_4_) * auVar16._0_4_;
          auVar8._20_4_ =
               (((auVar37._20_4_ + fVar23 +
                 fVar23 * fVar23 *
                 (((((fVar23 * 0.00019875691 + 0.0013981999) * fVar23 + 0.008333452) * fVar23 +
                   0.041665796) * fVar23 + 0.16666666) * fVar23 + 0.5)) * auVar25._4_4_ + -1.0) *
                auVar26._4_4_ + auVar31._20_4_) * auVar16._4_4_;
          auVar8._24_4_ =
               (((auVar37._24_4_ + fVar24 +
                 fVar24 * fVar24 *
                 (((((fVar24 * 0.00019875691 + 0.0013981999) * fVar24 + 0.008333452) * fVar24 +
                   0.041665796) * fVar24 + 0.16666666) * fVar24 + 0.5)) * auVar25._8_4_ + -1.0) *
                auVar26._8_4_ + auVar31._24_4_) * auVar16._8_4_;
          auVar8._28_4_ =
               auVar37._28_4_ + auVar29._28_4_ + -0.6931472 + -0.6931472 + -1.0 + auVar31._28_4_;
          *pauVar14 = auVar8;
          pauVar14 = pauVar14 + 1;
          iVar9 = iVar9 + 8;
        } while (iVar9 < (int)uVar13);
        uVar2 = (this->super_SELU).alpha;
        uVar5 = (this->super_SELU).lambda;
        auVar16._4_4_ = uVar5;
        auVar16._0_4_ = uVar2;
        auVar16._8_8_ = 0;
        auVar38 = ZEXT464(0) << 0x40;
        uVar11 = uVar13 & 0xfffffff8;
      }
      auVar26._8_4_ = 0x42b0c0a5;
      auVar26._0_8_ = 0x42b0c0a542b0c0a5;
      auVar26._12_4_ = 0x42b0c0a5;
      auVar33._8_4_ = 0xc2b0c0a5;
      auVar33._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar33._12_4_ = 0xc2b0c0a5;
      if ((int)(uVar11 | 3) < (int)uVar13) {
        auVar25 = vshufps_avx(auVar16,auVar16,0);
        auVar16 = vshufps_avx(auVar16,auVar16,0x55);
        uVar10 = uVar11;
        do {
          auVar28 = vminps_avx(auVar38._0_16_,*(undefined1 (*) [16])*pauVar14);
          auVar28 = vminps_avx(auVar28,auVar26);
          auVar17 = vmaxps_avx(auVar28,auVar33);
          auVar28._0_4_ = auVar17._0_4_ * 1.442695 + 0.5;
          auVar28._4_4_ = auVar17._4_4_ * 1.442695 + 0.5;
          auVar28._8_4_ = auVar17._8_4_ * 1.442695 + 0.5;
          auVar28._12_4_ = auVar17._12_4_ * 1.442695 + 0.5;
          auVar34._0_4_ = (int)auVar28._0_4_;
          auVar34._4_4_ = (int)auVar28._4_4_;
          auVar34._8_4_ = (int)auVar28._8_4_;
          auVar34._12_4_ = (int)auVar28._12_4_;
          auVar27 = vcvtdq2ps_avx(auVar34);
          auVar28 = vcmpps_avx(auVar28,auVar27,1);
          auVar28 = vandps_avx(auVar35,auVar28);
          auVar28 = vsubps_avx(auVar27,auVar28);
          fVar18 = auVar17._0_4_ + auVar28._0_4_ * -0.6931472;
          fVar19 = auVar17._4_4_ + auVar28._4_4_ * -0.6931472;
          fVar20 = auVar17._8_4_ + auVar28._8_4_ * -0.6931472;
          fVar21 = auVar17._12_4_ + auVar28._12_4_ * -0.6931472;
          auVar27._0_4_ = (int)auVar28._0_4_;
          auVar27._4_4_ = (int)auVar28._4_4_;
          auVar27._8_4_ = (int)auVar28._8_4_;
          auVar27._12_4_ = (int)auVar28._12_4_;
          auVar28 = vpslld_avx(auVar27,0x17);
          auVar27 = vpaddd_avx(auVar35,auVar28);
          auVar28 = vmaxps_avx(auVar38._0_16_,*(undefined1 (*) [16])*pauVar14);
          auVar17._0_4_ =
               (((auVar36._0_4_ + fVar18 +
                 fVar18 * fVar18 *
                 (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
                   0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5)) * auVar27._0_4_ + -1.0) *
                auVar25._0_4_ + auVar28._0_4_) * auVar16._0_4_;
          auVar17._4_4_ =
               (((auVar36._4_4_ + fVar19 +
                 fVar19 * fVar19 *
                 (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
                   0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5)) * auVar27._4_4_ + -1.0) *
                auVar25._4_4_ + auVar28._4_4_) * auVar16._4_4_;
          auVar17._8_4_ =
               (((auVar36._8_4_ + fVar20 +
                 fVar20 * fVar20 *
                 (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
                   0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5)) * auVar27._8_4_ + -1.0) *
                auVar25._8_4_ + auVar28._8_4_) * auVar16._8_4_;
          auVar17._12_4_ =
               (((auVar36._12_4_ + fVar21 +
                 fVar21 * fVar21 *
                 (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
                   0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5)) * auVar27._12_4_ + -1.0) *
                auVar25._12_4_ + auVar28._12_4_) * auVar16._12_4_;
          *(undefined1 (*) [16])*pauVar14 = auVar17;
          pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
          uVar11 = uVar10 + 4;
          iVar9 = uVar10 + 7;
          uVar10 = uVar11;
        } while (iVar9 < (int)uVar13);
        uVar3 = (this->super_SELU).alpha;
        uVar6 = (this->super_SELU).lambda;
        auVar16._4_4_ = uVar6;
        auVar16._0_4_ = uVar3;
        auVar16._8_8_ = 0;
      }
      if (uVar13 - uVar11 != 0 && (int)uVar11 <= (int)uVar13) {
        auVar35 = vmovshdup_avx(auVar16);
        lVar12 = 0;
        do {
          fVar18 = *(float *)(*pauVar14 + lVar12 * 4);
          if (0.0 <= fVar18) {
            fVar18 = fVar18 * (this->super_SELU).lambda;
          }
          else {
            fVar18 = expf(fVar18);
            auVar38 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar36 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
            auVar37 = ZEXT3264(CONCAT428(0x3f800000,
                                         CONCAT424(0x3f800000,
                                                   CONCAT420(0x3f800000,
                                                             CONCAT416(0x3f800000,
                                                                       CONCAT412(0x3f800000,
                                                                                 CONCAT48(0x3f800000
                                                                                          ,
                                                  0x3f8000003f800000)))))));
            fVar18 = (fVar18 + -1.0) * auVar35._0_4_ * auVar16._0_4_;
          }
          *(float *)(*pauVar14 + lVar12 * 4) = fVar18;
          lVar12 = lVar12 + 1;
        } while (uVar13 - uVar11 != (int)lVar12);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != iVar7);
  }
  return 0;
}

Assistant:

int SELU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero512 = _mm512_setzero_ps();
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        __m512 _lambda512 = _mm512_set1_ps(lambda);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);

            __m512 _pos = _mm512_max_ps(_zero512, _p);
            __m512 _neg = _mm512_min_ps(_zero512, _p);

            __m512 _blob = exp512_ps(_neg);
            _blob = _mm512_sub_ps(_blob, _one512);
            _blob = _mm512_mul_ps(_alpha512, _blob);
            _blob = _mm512_mul_ps(_lambda512, _mm512_add_ps(_pos, _blob));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero256 = _mm256_setzero_ps();
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        __m256 _lambda256 = _mm256_set1_ps(lambda);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);

            __m256 _pos = _mm256_max_ps(_zero256, _p);
            __m256 _neg = _mm256_min_ps(_zero256, _p);

            __m256 _blob = exp256_ps(_neg);
            _blob = _mm256_sub_ps(_blob, _one256);
            _blob = _mm256_mul_ps(_alpha256, _blob);
            _blob = _mm256_mul_ps(_lambda256, _mm256_add_ps(_pos, _blob));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero128 = _mm_setzero_ps();
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _alpha128 = _mm_set1_ps(alpha);
        __m128 _lambda128 = _mm_set1_ps(lambda);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);

            __m128 _pos = _mm_max_ps(_zero128, _p);
            __m128 _neg = _mm_min_ps(_zero128, _p);

            __m128 _blob = exp_ps(_neg);
            _blob = _mm_sub_ps(_blob, _one128);
            _blob = _mm_mul_ps(_alpha128, _blob);
            _blob = _mm_mul_ps(_lambda128, _mm_add_ps(_pos, _blob));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        float alphaxlambda = alpha * lambda;
        for (; i < size; i++)
        {
            // y = lambda * ( max(0, x) + min(0, alpha * (exp(x) - 1)) )
            if (*ptr < 0)
                *ptr = (expf(*ptr) - 1.f) * alphaxlambda;
            else
                *ptr = *ptr * lambda;
            ptr++;
        }
    }

    return 0;
}